

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str_split.cc
# Opt level: O0

string_view __thiscall
absl::lts_20250127::ByLength::Find(ByLength *this,string_view text,size_t pos)

{
  unsigned_long *puVar1;
  size_type sVar2;
  const_pointer pvVar3;
  undefined1 local_50 [8];
  string_view substr;
  size_t local_38;
  size_t pos_local;
  ByLength *this_local;
  string_view text_local;
  
  text_local._M_len = (size_t)text._M_str;
  this_local = (ByLength *)text._M_len;
  local_38 = pos;
  pos_local = (size_t)this;
  substr._M_str =
       (char *)std::basic_string_view<char,_std::char_traits<char>_>::size
                         ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
  puVar1 = std::min<unsigned_long>(&local_38,(unsigned_long *)&substr._M_str);
  local_38 = *puVar1;
  _local_50 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                        ((basic_string_view<char,_std::char_traits<char>_> *)&this_local,local_38,
                         0xffffffffffffffff);
  sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::length
                    ((basic_string_view<char,_std::char_traits<char>_> *)local_50);
  if ((ulong)this->length_ < sVar2) {
    pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::data
                       ((basic_string_view<char,_std::char_traits<char>_> *)local_50);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)&text_local._M_str,
               pvVar3 + this->length_,0);
  }
  else {
    pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::data
                       ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
    sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::size
                      ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)&text_local._M_str,pvVar3 + sVar2
               ,0);
  }
  return stack0xffffffffffffffe8;
}

Assistant:

absl::string_view ByLength::Find(absl::string_view text, size_t pos) const {
  pos = std::min(pos, text.size());  // truncate `pos`
  absl::string_view substr = text.substr(pos);
  // If the string is shorter than the chunk size we say we
  // "can't find the delimiter" so this will be the last chunk.
  if (substr.length() <= static_cast<size_t>(length_))
    return absl::string_view(text.data() + text.size(), 0);

  return absl::string_view(substr.data() + length_, 0);
}